

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O3

int __thiscall
CVmObjStringBuffer::getp_delete
          (CVmObjStringBuffer *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  int iVar2;
  int32_t del_chars;
  bool bVar3;
  
  if (oargc == (uint *)0x0) {
    bVar3 = false;
  }
  else {
    bVar3 = 1 < *oargc;
  }
  if (getp_delete(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_delete();
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,oargc,&getp_delete::desc);
  if (iVar1 == 0) {
    iVar2 = CVmBif::pop_int_val();
    iVar1 = -1;
    if (iVar2 < 0) {
      iVar1 = *(int *)(this->super_CVmObject).ext_;
    }
    if (bVar3) {
      del_chars = CVmBif::pop_int_val();
    }
    else {
      del_chars = *(int32_t *)(this->super_CVmObject).ext_;
    }
    splice_text(this,self,iVar1 + iVar2,del_chars,(wchar_t *)0x0,0,1);
    retval->typ = VM_OBJ;
    (retval->val).obj = self;
  }
  return 1;
}

Assistant:

int CVmObjStringBuffer::getp_delete(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1, 2);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* pop the deletion index and adjust to 0-based or end-based */
    int32_t idx = CVmBif::pop_int_val(vmg0_);
    idx += (idx < 0 ? get_ext()->len : -1);

    /* pop the length, if provided; if not, delete the rest of the string */
    int32_t len;
    if (argc >= 2)
        len = CVmBif::pop_int_val(vmg0_);
    else
        len = get_ext()->len;

    /* do the delete */
    delete_text(vmg_ self, idx, len, TRUE);

    /* handled */
    retval->set_obj(self);
    return TRUE;
}